

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_attribute * __thiscall pugi::xml_attribute::operator=(xml_attribute *this,bool rhs)

{
  xml_attribute_struct *header;
  char *source;
  
  header = this->_attr;
  if (header != (xml_attribute_struct *)0x0) {
    source = "false";
    if (rhs) {
      source = "true";
    }
    impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
              ((char **)&header->value,&header->header,0x10,(char_t *)source,(ulong)rhs ^ 5);
  }
  return this;
}

Assistant:

PUGI__FN xml_attribute& xml_attribute::operator=(bool rhs)
	{
		set_value(rhs);
		return *this;
	}